

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O3

bool __thiscall QHttpMultiPartIODevice::reset(QHttpMultiPartIODevice *this)

{
  char cVar1;
  pointer pQVar2;
  QHttpMultiPartPrivate *pQVar3;
  ulong uVar4;
  QHttpPartPrivate *pQVar5;
  QSharedDataPointer<QHttpPartPrivate> *this_00;
  long lVar6;
  
  QIODevice::reset();
  pQVar3 = this->multiPart;
  if ((pQVar3->parts).d.size != 0) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      pQVar2 = QList<QHttpPart>::data(&pQVar3->parts);
      pQVar5 = *(QHttpPartPrivate **)((long)&(pQVar2->d).d.ptr + lVar6);
      if (pQVar5 == (QHttpPartPrivate *)0x0) {
        pQVar5 = (QHttpPartPrivate *)0x0;
      }
      else if ((pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
        this_00 = (QSharedDataPointer<QHttpPartPrivate> *)((long)&(pQVar2->d).d.ptr + lVar6);
        QSharedDataPointer<QHttpPartPrivate>::detach_helper(this_00);
        pQVar5 = (this_00->d).ptr;
      }
      if (pQVar5->bodyDevice == (QIODevice *)0x0) {
        pQVar5->readPointer = 0;
      }
      else {
        cVar1 = (**(code **)(*(long *)pQVar5->bodyDevice + 0x98))();
        pQVar5->readPointer = 0;
        if (cVar1 == '\0') {
          return false;
        }
      }
      uVar4 = uVar4 + 1;
      pQVar3 = this->multiPart;
      lVar6 = lVar6 + 8;
    } while (uVar4 < (ulong)(pQVar3->parts).d.size);
  }
  this->readPointer = 0;
  return true;
}

Assistant:

bool QHttpMultiPartIODevice::reset()
{
    // Reset QIODevice's data
    QIODevice::reset();
    for (int a = 0; a < multiPart->parts.size(); a++)
        if (!multiPart->parts[a].d->reset())
            return false;
    readPointer = 0;
    return true;
}